

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_msl.cpp
# Opt level: O1

string * __thiscall
spirv_cross::CompilerMSL::to_struct_member
          (string *__return_storage_ptr__,CompilerMSL *this,SPIRType *type,uint32_t member_type_id,
          uint32_t index,string *qualifier)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  char cVar2;
  bool bVar3;
  bool bVar4;
  char cVar5;
  SPIRType *type_00;
  undefined8 *puVar6;
  long *plVar7;
  SPIRVariable *pSVar8;
  SPIRType *pSVar9;
  runtime_error *prVar10;
  size_type *psVar11;
  ulong *puVar12;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar13;
  uint uVar14;
  uint uVar15;
  char *pcVar16;
  ulong uVar17;
  undefined8 uVar18;
  uint32_t uVar19;
  SPIRType *pSVar20;
  pair<std::_Rb_tree_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool>
  pVar21;
  char (*ts_7) [2];
  BuiltIn builtin;
  undefined4 uStack_294;
  size_type local_290;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_288;
  uint32_t local_278;
  ID local_274;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_270;
  string __str_2;
  string array_type;
  string td_line;
  string __str_1;
  string pack_pfx;
  string __str;
  SPIRType row_major_physical_type;
  
  bVar3 = CompilerGLSL::member_is_remapped_physical_type(&this->super_CompilerGLSL,type,index);
  if (bVar3) {
    member_type_id =
         Compiler::get_extended_member_decoration
                   ((Compiler *)this,(type->super_IVariant).self.id,index,
                    SPIRVCrossDecorationPhysicalTypeID);
  }
  type_00 = Variant::get<spirv_cross::SPIRType>
                      ((this->super_CompilerGLSL).super_Compiler.ir.ids.
                       super_VectorView<spirv_cross::Variant>.ptr + member_type_id);
  pack_pfx._M_dataplus._M_p = (pointer)&pack_pfx.field_2;
  pack_pfx._M_string_length = 0;
  pack_pfx.field_2._M_local_buf[0] = '\0';
  bVar3 = Compiler::has_extended_member_decoration
                    ((Compiler *)this,(type->super_IVariant).self.id,index,
                     SPIRVCrossDecorationInterfaceOrigID);
  local_274.id = 0;
  if (bVar3) {
    local_274.id = Compiler::get_extended_member_decoration
                             ((Compiler *)this,(type->super_IVariant).self.id,index,
                              SPIRVCrossDecorationInterfaceOrigID);
  }
  bVar3 = Compiler::is_matrix((Compiler *)this,type_00);
  bVar4 = false;
  if (bVar3) {
    bVar4 = Compiler::has_member_decoration
                      ((Compiler *)this,(TypeID)(type->super_IVariant).self.id,index,
                       DecorationRowMajor);
  }
  row_major_physical_type.array.super_VectorView<unsigned_int>.ptr =
       (uint *)&row_major_physical_type.array.stack_storage;
  row_major_physical_type.super_IVariant.self.id = 0;
  row_major_physical_type.super_IVariant._vptr_IVariant = (_func_int **)&PTR__SPIRType_003fd210;
  row_major_physical_type.super_IVariant._12_4_ = 0;
  row_major_physical_type.width = 0;
  row_major_physical_type.vecsize = 1;
  row_major_physical_type.columns = 1;
  row_major_physical_type.array.super_VectorView<unsigned_int>.buffer_size = 0;
  row_major_physical_type.array.buffer_capacity = 8;
  row_major_physical_type.array_size_literal.super_VectorView<bool>.ptr =
       (bool *)&row_major_physical_type.array_size_literal.stack_storage;
  row_major_physical_type.array_size_literal.super_VectorView<bool>.buffer_size = 0;
  row_major_physical_type.array_size_literal.buffer_capacity = 8;
  row_major_physical_type._120_8_ = (ulong)(ushort)row_major_physical_type._126_2_ << 0x30;
  row_major_physical_type.storage = StorageClassGeneric;
  row_major_physical_type.member_types.
  super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.ptr =
       (TypedID<(spirv_cross::Types)1> *)&row_major_physical_type.member_types.stack_storage;
  row_major_physical_type.member_types.
  super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.buffer_size = 0;
  row_major_physical_type.member_types.buffer_capacity = 8;
  row_major_physical_type.member_type_index_redirection.super_VectorView<unsigned_int>.ptr =
       (uint *)&row_major_physical_type.member_type_index_redirection.stack_storage;
  row_major_physical_type.member_type_index_redirection.super_VectorView<unsigned_int>.buffer_size =
       0;
  row_major_physical_type.member_type_index_redirection.buffer_capacity = 8;
  row_major_physical_type.image._0_8_ = (ulong)row_major_physical_type.image.dim << 0x20;
  row_major_physical_type.type_alias.id = 0;
  row_major_physical_type.parent_type.id = 0;
  row_major_physical_type.member_name_cache._M_h._M_buckets =
       &row_major_physical_type.member_name_cache._M_h._M_single_bucket;
  row_major_physical_type.member_name_cache._M_h._M_bucket_count = 1;
  row_major_physical_type.member_name_cache._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  row_major_physical_type.member_name_cache._M_h._M_element_count = 0;
  row_major_physical_type.member_name_cache._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  row_major_physical_type.member_name_cache._M_h._M_rehash_policy._M_next_resize = 0;
  row_major_physical_type.member_name_cache._M_h._M_single_bucket = (__node_base_ptr)0x0;
  bVar3 = Compiler::has_member_decoration
                    ((Compiler *)this,(TypeID)(type->super_IVariant).self.id,index,DecorationOffset)
  ;
  if ((bVar3) ||
     (bVar3 = Compiler::has_extended_member_decoration
                        ((Compiler *)this,(type->super_IVariant).self.id,index,
                         SPIRVCrossDecorationResourceIndexPrimary), bVar3)) {
    this->is_using_builtin_array = true;
  }
  bVar3 = CompilerGLSL::member_is_packed_physical_type(&this->super_CompilerGLSL,type,index);
  pSVar20 = type_00;
  if (bVar3) {
    if (*(int *)&(type_00->super_IVariant).field_0xc == 0xf) {
      prVar10 = (runtime_error *)__cxa_allocate_exception(0x10);
      array_type._M_dataplus._M_p = (pointer)&array_type.field_2;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&array_type,"Cannot emit a packed struct currently.","");
      ::std::runtime_error::runtime_error(prVar10,(string *)&array_type);
      *(undefined ***)prVar10 = &PTR__runtime_error_003fce08;
      __cxa_throw(prVar10,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
    }
    bVar3 = Compiler::is_matrix((Compiler *)this,type_00);
    if (bVar3) {
      uVar19 = type_00->vecsize;
      local_278 = type_00->columns;
      ::std::__cxx11::string::_M_replace
                ((ulong)&pack_pfx,0,(char *)pack_pfx._M_string_length,0x37143d);
      if (bVar4 != false) {
        local_278 = type_00->vecsize;
        uVar19 = type_00->columns;
        ::std::__cxx11::string::_M_replace
                  ((ulong)&pack_pfx,0,(char *)pack_pfx._M_string_length,0x37af37);
      }
      bVar3 = type_00->width == 0x10;
      pcVar16 = "float";
      if (bVar3) {
        pcVar16 = "half";
      }
      array_type._M_dataplus._M_p = (pointer)&array_type.field_2;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&array_type,pcVar16,pcVar16 + ((ulong)bVar3 ^ 5));
      td_line._M_dataplus._M_p = (pointer)&td_line.field_2;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)&td_line,"typedef ","");
      ::std::operator+(&local_270,"packed_",&array_type);
      cVar5 = '\x01';
      if (9 < uVar19) {
        uVar17 = (ulong)uVar19;
        cVar2 = '\x04';
        do {
          cVar5 = cVar2;
          uVar14 = (uint)uVar17;
          if (uVar14 < 100) {
            cVar5 = cVar5 + -2;
            goto LAB_002da4a7;
          }
          if (uVar14 < 1000) {
            cVar5 = cVar5 + -1;
            goto LAB_002da4a7;
          }
          if (uVar14 < 10000) goto LAB_002da4a7;
          uVar17 = uVar17 / 10000;
          cVar2 = cVar5 + '\x04';
        } while (99999 < uVar14);
        cVar5 = cVar5 + '\x01';
      }
LAB_002da4a7:
      paVar1 = &__str_2.field_2;
      __str_2._M_dataplus._M_p = (pointer)paVar1;
      ::std::__cxx11::string::_M_construct((ulong)&__str_2,cVar5);
      ::std::__detail::__to_chars_10_impl<unsigned_int>
                (__str_2._M_dataplus._M_p,(uint)__str_2._M_string_length,uVar19);
      uVar18 = 0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_270._M_dataplus._M_p != &local_270.field_2) {
        uVar18 = local_270.field_2._M_allocated_capacity;
      }
      if ((ulong)uVar18 < __str_2._M_string_length + local_270._M_string_length) {
        uVar18 = 0xf;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)__str_2._M_dataplus._M_p != paVar1) {
          uVar18 = __str_2.field_2._M_allocated_capacity;
        }
        if ((ulong)uVar18 < __str_2._M_string_length + local_270._M_string_length)
        goto LAB_002da50f;
        puVar6 = (undefined8 *)
                 ::std::__cxx11::string::replace
                           ((ulong)&__str_2,0,(char *)0x0,(ulong)local_270._M_dataplus._M_p);
      }
      else {
LAB_002da50f:
        puVar6 = (undefined8 *)
                 ::std::__cxx11::string::_M_append
                           ((char *)&local_270,(ulong)__str_2._M_dataplus._M_p);
      }
      _builtin = (pointer)&local_288;
      paVar13 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)(puVar6 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar6 == paVar13) {
        local_288._M_allocated_capacity = paVar13->_M_allocated_capacity;
        local_288._8_8_ = puVar6[3];
      }
      else {
        local_288._M_allocated_capacity = paVar13->_M_allocated_capacity;
        _builtin = (pointer)*puVar6;
      }
      local_290 = puVar6[1];
      *puVar6 = paVar13;
      puVar6[1] = 0;
      paVar13->_M_local_buf[0] = '\0';
      ::std::__cxx11::string::_M_append((char *)&td_line,(ulong)_builtin);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)_builtin != &local_288) {
        operator_delete(_builtin);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)__str_2._M_dataplus._M_p != paVar1) {
        operator_delete(__str_2._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_270._M_dataplus._M_p != &local_270.field_2) {
        operator_delete(local_270._M_dataplus._M_p);
      }
      ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&builtin
                       ," ",&pack_pfx);
      ::std::__cxx11::string::_M_append((char *)&td_line,(ulong)_builtin);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)_builtin != &local_288) {
        operator_delete(_builtin);
      }
      uVar14 = type_00->columns;
      cVar5 = '\x01';
      if (9 < uVar14) {
        uVar15 = uVar14;
        cVar2 = '\x04';
        do {
          cVar5 = cVar2;
          if (uVar15 < 100) {
            cVar5 = cVar5 + -2;
            goto LAB_002da64f;
          }
          if (uVar15 < 1000) {
            cVar5 = cVar5 + -1;
            goto LAB_002da64f;
          }
          if (uVar15 < 10000) goto LAB_002da64f;
          bVar3 = 99999 < uVar15;
          uVar15 = uVar15 / 10000;
          cVar2 = cVar5 + '\x04';
        } while (bVar3);
        cVar5 = cVar5 + '\x01';
      }
LAB_002da64f:
      __str._M_dataplus._M_p = (pointer)&__str.field_2;
      ::std::__cxx11::string::_M_construct((ulong)&__str,cVar5);
      ::std::__detail::__to_chars_10_impl<unsigned_int>
                (__str._M_dataplus._M_p,(uint)__str._M_string_length,uVar14);
      plVar7 = (long *)::std::__cxx11::string::replace
                                 ((ulong)&__str,0,(char *)0x0,(ulong)array_type._M_dataplus._M_p);
      __str_2._M_dataplus._M_p = (pointer)&__str_2.field_2;
      psVar11 = (size_type *)(plVar7 + 2);
      local_270._M_dataplus._M_p = (pointer)&local_270.field_2;
      if ((size_type *)*plVar7 == psVar11) {
        __str_2.field_2._M_allocated_capacity = *psVar11;
        __str_2.field_2._8_8_ = plVar7[3];
      }
      else {
        __str_2.field_2._M_allocated_capacity = *psVar11;
        __str_2._M_dataplus._M_p = (pointer)*plVar7;
      }
      __str_2._M_string_length = plVar7[1];
      *plVar7 = (long)psVar11;
      plVar7[1] = 0;
      *(undefined1 *)(plVar7 + 2) = 0;
      plVar7 = (long *)::std::__cxx11::string::append((char *)&__str_2);
      puVar12 = (ulong *)(plVar7 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar7 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)puVar12) {
        local_270.field_2._M_allocated_capacity = *puVar12;
        local_270.field_2._8_8_ = plVar7[3];
      }
      else {
        local_270.field_2._M_allocated_capacity = *puVar12;
        local_270._M_dataplus._M_p = (pointer)*plVar7;
      }
      local_270._M_string_length = plVar7[1];
      *plVar7 = (long)puVar12;
      plVar7[1] = 0;
      *(undefined1 *)(plVar7 + 2) = 0;
      uVar14 = type_00->vecsize;
      cVar5 = '\x01';
      if (9 < uVar14) {
        uVar15 = uVar14;
        cVar2 = '\x04';
        do {
          cVar5 = cVar2;
          if (uVar15 < 100) {
            cVar5 = cVar5 + -2;
            goto LAB_002da78b;
          }
          if (uVar15 < 1000) {
            cVar5 = cVar5 + -1;
            goto LAB_002da78b;
          }
          if (uVar15 < 10000) goto LAB_002da78b;
          bVar3 = 99999 < uVar15;
          uVar15 = uVar15 / 10000;
          cVar2 = cVar5 + '\x04';
        } while (bVar3);
        cVar5 = cVar5 + '\x01';
      }
LAB_002da78b:
      paVar1 = &__str_1.field_2;
      __str_1._M_dataplus._M_p = (pointer)paVar1;
      ::std::__cxx11::string::_M_construct((ulong)&__str_1,cVar5);
      ::std::__detail::__to_chars_10_impl<unsigned_int>
                (__str_1._M_dataplus._M_p,(uint)__str_1._M_string_length,uVar14);
      uVar17 = CONCAT44(__str_1._M_string_length._4_4_,(uint)__str_1._M_string_length) +
               local_270._M_string_length;
      uVar18 = 0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_270._M_dataplus._M_p != &local_270.field_2) {
        uVar18 = local_270.field_2._M_allocated_capacity;
      }
      if ((ulong)uVar18 < uVar17) {
        uVar18 = 0xf;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)__str_1._M_dataplus._M_p != paVar1) {
          uVar18 = __str_1.field_2._M_allocated_capacity;
        }
        if ((ulong)uVar18 < uVar17) goto LAB_002da80a;
        puVar6 = (undefined8 *)
                 ::std::__cxx11::string::replace
                           ((ulong)&__str_1,0,(char *)0x0,(ulong)local_270._M_dataplus._M_p);
      }
      else {
LAB_002da80a:
        puVar6 = (undefined8 *)
                 ::std::__cxx11::string::_M_append
                           ((char *)&local_270,(ulong)__str_1._M_dataplus._M_p);
      }
      _builtin = (pointer)&local_288;
      paVar13 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)(puVar6 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar6 == paVar13) {
        local_288._M_allocated_capacity = paVar13->_M_allocated_capacity;
        local_288._8_8_ = puVar6[3];
      }
      else {
        local_288._M_allocated_capacity = paVar13->_M_allocated_capacity;
        _builtin = (pointer)*puVar6;
      }
      local_290 = puVar6[1];
      *puVar6 = paVar13;
      puVar6[1] = 0;
      paVar13->_M_local_buf[0] = '\0';
      ::std::__cxx11::string::_M_append((char *)&td_line,(ulong)_builtin);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)_builtin != &local_288) {
        operator_delete(_builtin);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)__str_1._M_dataplus._M_p != paVar1) {
        operator_delete(__str_1._M_dataplus._M_p);
      }
      paVar1 = &__str_2.field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_270._M_dataplus._M_p != &local_270.field_2) {
        operator_delete(local_270._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)__str_2._M_dataplus._M_p != paVar1) {
        operator_delete(__str_2._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)__str._M_dataplus._M_p != &__str.field_2) {
        operator_delete(__str._M_dataplus._M_p);
      }
      cVar5 = '\x01';
      if (9 < local_278) {
        uVar19 = local_278;
        cVar2 = '\x04';
        do {
          cVar5 = cVar2;
          if (uVar19 < 100) {
            cVar5 = cVar5 + -2;
            goto LAB_002da93f;
          }
          if (uVar19 < 1000) {
            cVar5 = cVar5 + -1;
            goto LAB_002da93f;
          }
          if (uVar19 < 10000) goto LAB_002da93f;
          bVar3 = 99999 < uVar19;
          uVar19 = uVar19 / 10000;
          cVar2 = cVar5 + '\x04';
        } while (bVar3);
        cVar5 = cVar5 + '\x01';
      }
LAB_002da93f:
      __str_2._M_dataplus._M_p = (pointer)paVar1;
      ::std::__cxx11::string::_M_construct((ulong)&__str_2,cVar5);
      ::std::__detail::__to_chars_10_impl<unsigned_int>
                (__str_2._M_dataplus._M_p,(uint)__str_2._M_string_length,local_278);
      plVar7 = (long *)::std::__cxx11::string::replace((ulong)&__str_2,0,(char *)0x0,0x36a571);
      puVar12 = (ulong *)(plVar7 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar7 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)puVar12) {
        local_270.field_2._M_allocated_capacity = *puVar12;
        local_270.field_2._8_8_ = plVar7[3];
        local_270._M_dataplus._M_p = (pointer)&local_270.field_2;
      }
      else {
        local_270.field_2._M_allocated_capacity = *puVar12;
        local_270._M_dataplus._M_p = (pointer)*plVar7;
      }
      local_270._M_string_length = plVar7[1];
      *plVar7 = (long)puVar12;
      plVar7[1] = 0;
      *(undefined1 *)(plVar7 + 2) = 0;
      plVar7 = (long *)::std::__cxx11::string::append((char *)&local_270);
      _builtin = (pointer)&local_288;
      paVar13 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)(plVar7 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar7 == paVar13) {
        local_288._M_allocated_capacity = paVar13->_M_allocated_capacity;
        local_288._8_8_ = plVar7[3];
      }
      else {
        local_288._M_allocated_capacity = paVar13->_M_allocated_capacity;
        _builtin = (pointer)*plVar7;
      }
      local_290 = plVar7[1];
      *plVar7 = (long)paVar13;
      plVar7[1] = 0;
      *(undefined1 *)(plVar7 + 2) = 0;
      ::std::__cxx11::string::_M_append((char *)&td_line,(ulong)_builtin);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)_builtin != &local_288) {
        operator_delete(_builtin);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_270._M_dataplus._M_p != &local_270.field_2) {
        operator_delete(local_270._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)__str_2._M_dataplus._M_p != paVar1) {
        operator_delete(__str_2._M_dataplus._M_p);
      }
      ::std::__cxx11::string::append((char *)&td_line);
      pVar21 = ::std::
               _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
               ::_M_insert_unique<std::__cxx11::string_const&>
                         ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                           *)&this->typedef_lines,&td_line);
      if (((undefined1  [16])pVar21 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
        Compiler::force_recompile((Compiler *)this);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)td_line._M_dataplus._M_p != &td_line.field_2) {
        operator_delete(td_line._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)array_type._M_dataplus._M_p != &array_type.field_2) {
        operator_delete(array_type._M_dataplus._M_p);
      }
    }
    else {
      bVar3 = Compiler::is_scalar((Compiler *)this,type_00);
      if (!bVar3) {
        ::std::__cxx11::string::_M_replace
                  ((ulong)&pack_pfx,0,(char *)pack_pfx._M_string_length,0x37143d);
      }
    }
  }
  else {
    bVar3 = Compiler::is_matrix((Compiler *)this,type_00);
    if (bVar3) {
      if (((this->msl_options).msl_version < 30000) &&
         (bVar3 = Compiler::has_extended_decoration
                            ((Compiler *)this,(type->super_IVariant).self.id,
                             SPIRVCrossDecorationWorkgroupStruct), bVar3)) {
        ::std::__cxx11::string::_M_replace
                  ((ulong)&pack_pfx,0,(char *)pack_pfx._M_string_length,0x37af4b);
        add_spv_func_and_recompile(this,SPVFuncImplStorageMatrix);
        this->is_using_builtin_array = true;
      }
      if (bVar4 != false) {
        row_major_physical_type.super_IVariant.self.id = (type_00->super_IVariant).self.id;
        row_major_physical_type._12_8_ = *(undefined8 *)&(type_00->super_IVariant).field_0xc;
        row_major_physical_type.vecsize = type_00->vecsize;
        row_major_physical_type.columns = type_00->columns;
        SmallVector<unsigned_int,_8UL>::operator=(&row_major_physical_type.array,&type_00->array);
        SmallVector<bool,_8UL>::operator=
                  (&row_major_physical_type.array_size_literal,&type_00->array_size_literal);
        row_major_physical_type.pointer_depth = type_00->pointer_depth;
        row_major_physical_type.pointer = type_00->pointer;
        row_major_physical_type.forward_pointer = type_00->forward_pointer;
        row_major_physical_type._126_2_ = *(undefined2 *)&type_00->field_0x7e;
        row_major_physical_type.storage = type_00->storage;
        SmallVector<spirv_cross::TypedID<(spirv_cross::Types)1>,_8UL>::operator=
                  (&row_major_physical_type.member_types,&type_00->member_types);
        SmallVector<unsigned_int,_8UL>::operator=
                  (&row_major_physical_type.member_type_index_redirection,
                   &type_00->member_type_index_redirection);
        row_major_physical_type.image.type.id = (type_00->image).type.id;
        row_major_physical_type.image.dim = (type_00->image).dim;
        row_major_physical_type.image.depth = (type_00->image).depth;
        row_major_physical_type.image.arrayed = (type_00->image).arrayed;
        row_major_physical_type.image.ms = (type_00->image).ms;
        row_major_physical_type.image._11_1_ = (type_00->image).field_0xb;
        row_major_physical_type.image.sampled = (type_00->image).sampled;
        row_major_physical_type.image.format = (type_00->image).format;
        row_major_physical_type.image.access = (type_00->image).access;
        row_major_physical_type.type_alias.id = (type_00->type_alias).id;
        row_major_physical_type.parent_type.id = (type_00->parent_type).id;
        if (type_00 != &row_major_physical_type) {
          ::std::
          _Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
          ::
          _M_assign_elements<std::_Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>const&>
                    ((_Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                      *)&row_major_physical_type.member_name_cache,
                     &(type_00->member_name_cache)._M_h);
        }
        row_major_physical_type._20_8_ =
             row_major_physical_type._20_8_ << 0x20 | (ulong)row_major_physical_type._20_8_ >> 0x20;
        pSVar20 = &row_major_physical_type;
      }
    }
  }
  if ((((*(int *)&(type_00->super_IVariant).field_0xc == 0x10) && ((type_00->image).sampled == 2))
      && ((this->msl_options).platform == iOS)) &&
     (((int)(this->msl_options).argument_buffers_tier < 1 &&
      (bVar3 = Compiler::has_decoration((Compiler *)this,local_274,DecorationNonWritable), !bVar3)))
     ) {
    prVar10 = (runtime_error *)__cxa_allocate_exception(0x10);
    array_type._M_dataplus._M_p = (pointer)&array_type.field_2;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)&array_type,
               "Writable images are not allowed on Tier1 argument buffers on iOS.","");
    ::std::runtime_error::runtime_error(prVar10,(string *)&array_type);
    *(undefined ***)prVar10 = &PTR__runtime_error_003fce08;
    __cxa_throw(prVar10,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
  }
  paVar1 = &array_type.field_2;
  array_type._M_string_length = 0;
  array_type.field_2._M_local_buf[0] = '\0';
  array_type._M_dataplus._M_p = (pointer)paVar1;
  if (*(int *)&(type_00->super_IVariant).field_0xc - 0x10U < 3) goto LAB_002dac0a;
  builtin = 0x7fffffff;
  uVar17 = (ulong)(this->stage_out_var_id).id;
  if (uVar17 == 0) {
LAB_002dab6a:
    uVar17 = (ulong)(this->stage_in_var_id).id;
    if (uVar17 != 0) {
      pSVar8 = Variant::get<spirv_cross::SPIRVariable>
                         ((this->super_CompilerGLSL).super_Compiler.ir.ids.
                          super_VectorView<spirv_cross::Variant>.ptr + uVar17);
      pSVar9 = Compiler::get_variable_data_type((Compiler *)this,pSVar8);
      if (((pSVar9->super_IVariant).self.id == (type->super_IVariant).self.id) &&
         (bVar3 = variable_storage_requires_stage_io(this,StorageClassInput), bVar3))
      goto LAB_002dabad;
    }
  }
  else {
    pSVar8 = Variant::get<spirv_cross::SPIRVariable>
                       ((this->super_CompilerGLSL).super_Compiler.ir.ids.
                        super_VectorView<spirv_cross::Variant>.ptr + uVar17);
    pSVar9 = Compiler::get_variable_data_type((Compiler *)this,pSVar8);
    if (((pSVar9->super_IVariant).self.id != (type->super_IVariant).self.id) ||
       ((this->capture_output_to_buffer & 1U) != 0)) goto LAB_002dab6a;
LAB_002dabad:
    bVar3 = Compiler::is_member_builtin((Compiler *)this,type,index,&builtin);
    if (bVar3) {
      this->is_using_builtin_array = true;
    }
  }
  (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x26])(&td_line,this,type_00);
  ::std::__cxx11::string::operator=((string *)&array_type,(string *)&td_line);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)td_line._M_dataplus._M_p != &td_line.field_2) {
    operator_delete(td_line._M_dataplus._M_p);
  }
LAB_002dac0a:
  type_to_glsl_abi_cxx11_(&td_line,this,pSVar20,local_274.id,true);
  CompilerGLSL::to_member_name_abi_cxx11_((string *)&builtin,&this->super_CompilerGLSL,type,index);
  ts_7 = (char (*) [2])0x2dac4c;
  member_attribute_qualifier_abi_cxx11_(&local_270,this,type,index);
  join<std::__cxx11::string&,std::__cxx11::string,char_const(&)[2],std::__cxx11::string_const&,std::__cxx11::string,std::__cxx11::string,std::__cxx11::string&,char_const(&)[2]>
            (__return_storage_ptr__,(spirv_cross *)&pack_pfx,&td_line,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x366d9b,
             (char (*) [2])qualifier,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&builtin,
             &local_270,&array_type,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x365574,ts_7);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_270._M_dataplus._M_p != &local_270.field_2) {
    operator_delete(local_270._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)_builtin != &local_288) {
    operator_delete(_builtin);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)td_line._M_dataplus._M_p != &td_line.field_2) {
    operator_delete(td_line._M_dataplus._M_p);
  }
  this->is_using_builtin_array = false;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)array_type._M_dataplus._M_p != paVar1) {
    operator_delete(array_type._M_dataplus._M_p);
  }
  row_major_physical_type.super_IVariant._vptr_IVariant = (_func_int **)&PTR__SPIRType_003fd210;
  ::std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  ::~_Hashtable(&row_major_physical_type.member_name_cache._M_h);
  row_major_physical_type.member_type_index_redirection.super_VectorView<unsigned_int>.buffer_size =
       0;
  if ((AlignedBuffer<unsigned_int,_8UL> *)
      row_major_physical_type.member_type_index_redirection.super_VectorView<unsigned_int>.ptr !=
      &row_major_physical_type.member_type_index_redirection.stack_storage) {
    free(row_major_physical_type.member_type_index_redirection.super_VectorView<unsigned_int>.ptr);
  }
  row_major_physical_type.member_types.
  super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.buffer_size = 0;
  if ((AlignedBuffer<spirv_cross::TypedID<(spirv_cross::Types)1>,_8UL> *)
      row_major_physical_type.member_types.
      super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.ptr !=
      &row_major_physical_type.member_types.stack_storage) {
    free(row_major_physical_type.member_types.
         super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.ptr);
  }
  row_major_physical_type.array_size_literal.super_VectorView<bool>.buffer_size = 0;
  if ((AlignedBuffer<bool,_8UL> *)
      row_major_physical_type.array_size_literal.super_VectorView<bool>.ptr !=
      &row_major_physical_type.array_size_literal.stack_storage) {
    free(row_major_physical_type.array_size_literal.super_VectorView<bool>.ptr);
  }
  row_major_physical_type.array.super_VectorView<unsigned_int>.buffer_size = 0;
  if ((AlignedBuffer<unsigned_int,_8UL> *)
      row_major_physical_type.array.super_VectorView<unsigned_int>.ptr !=
      &row_major_physical_type.array.stack_storage) {
    free(row_major_physical_type.array.super_VectorView<unsigned_int>.ptr);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pack_pfx._M_dataplus._M_p != &pack_pfx.field_2) {
    operator_delete(pack_pfx._M_dataplus._M_p);
  }
  return __return_storage_ptr__;
}

Assistant:

string CompilerMSL::to_struct_member(const SPIRType &type, uint32_t member_type_id, uint32_t index,
                                     const string &qualifier)
{
	if (member_is_remapped_physical_type(type, index))
		member_type_id = get_extended_member_decoration(type.self, index, SPIRVCrossDecorationPhysicalTypeID);
	auto &physical_type = get<SPIRType>(member_type_id);

	// If this member is packed, mark it as so.
	string pack_pfx;

	// Allow Metal to use the array<T> template to make arrays a value type
	uint32_t orig_id = 0;
	if (has_extended_member_decoration(type.self, index, SPIRVCrossDecorationInterfaceOrigID))
		orig_id = get_extended_member_decoration(type.self, index, SPIRVCrossDecorationInterfaceOrigID);

	bool row_major = false;
	if (is_matrix(physical_type))
		row_major = has_member_decoration(type.self, index, DecorationRowMajor);

	SPIRType row_major_physical_type;
	const SPIRType *declared_type = &physical_type;

	// If a struct is being declared with physical layout,
	// do not use array<T> wrappers.
	// This avoids a lot of complicated cases with packed vectors and matrices,
	// and generally we cannot copy full arrays in and out of buffers into Function
	// address space.
	// Array of resources should also be declared as builtin arrays.
	if (has_member_decoration(type.self, index, DecorationOffset))
		is_using_builtin_array = true;
	else if (has_extended_member_decoration(type.self, index, SPIRVCrossDecorationResourceIndexPrimary))
		is_using_builtin_array = true;

	if (member_is_packed_physical_type(type, index))
	{
		// If we're packing a matrix, output an appropriate typedef
		if (physical_type.basetype == SPIRType::Struct)
		{
			SPIRV_CROSS_THROW("Cannot emit a packed struct currently.");
		}
		else if (is_matrix(physical_type))
		{
			uint32_t rows = physical_type.vecsize;
			uint32_t cols = physical_type.columns;
			pack_pfx = "packed_";
			if (row_major)
			{
				// These are stored transposed.
				rows = physical_type.columns;
				cols = physical_type.vecsize;
				pack_pfx = "packed_rm_";
			}
			string base_type = physical_type.width == 16 ? "half" : "float";
			string td_line = "typedef ";
			td_line += "packed_" + base_type + to_string(rows);
			td_line += " " + pack_pfx;
			// Use the actual matrix size here.
			td_line += base_type + to_string(physical_type.columns) + "x" + to_string(physical_type.vecsize);
			td_line += "[" + to_string(cols) + "]";
			td_line += ";";
			add_typedef_line(td_line);
		}
		else if (!is_scalar(physical_type)) // scalar type is already packed.
			pack_pfx = "packed_";
	}
	else if (is_matrix(physical_type))
	{
		if (!msl_options.supports_msl_version(3, 0) &&
		    has_extended_decoration(type.self, SPIRVCrossDecorationWorkgroupStruct))
		{
			pack_pfx = "spvStorage_";
			add_spv_func_and_recompile(SPVFuncImplStorageMatrix);
			// The pack prefix causes problems with array<T> wrappers.
			is_using_builtin_array = true;
		}
		if (row_major)
		{
			// Need to declare type with flipped vecsize/columns.
			row_major_physical_type = physical_type;
			swap(row_major_physical_type.vecsize, row_major_physical_type.columns);
			declared_type = &row_major_physical_type;
		}
	}

	// iOS Tier 1 argument buffers do not support writable images.
	if (physical_type.basetype == SPIRType::Image &&
		physical_type.image.sampled == 2 &&
		msl_options.is_ios() &&
		msl_options.argument_buffers_tier <= Options::ArgumentBuffersTier::Tier1 &&
		!has_decoration(orig_id, DecorationNonWritable))
	{
		SPIRV_CROSS_THROW("Writable images are not allowed on Tier1 argument buffers on iOS.");
	}

	// Array information is baked into these types.
	string array_type;
	if (physical_type.basetype != SPIRType::Image && physical_type.basetype != SPIRType::Sampler &&
	    physical_type.basetype != SPIRType::SampledImage)
	{
		BuiltIn builtin = BuiltInMax;

		// Special handling. In [[stage_out]] or [[stage_in]] blocks,
		// we need flat arrays, but if we're somehow declaring gl_PerVertex for constant array reasons, we want
		// template array types to be declared.
		bool is_ib_in_out =
				((stage_out_var_id && get_stage_out_struct_type().self == type.self &&
				  variable_storage_requires_stage_io(StorageClassOutput)) ||
				 (stage_in_var_id && get_stage_in_struct_type().self == type.self &&
				  variable_storage_requires_stage_io(StorageClassInput)));
		if (is_ib_in_out && is_member_builtin(type, index, &builtin))
			is_using_builtin_array = true;
		array_type = type_to_array_glsl(physical_type);
	}

	auto result = join(pack_pfx, type_to_glsl(*declared_type, orig_id, true), " ", qualifier,
	                   to_member_name(type, index), member_attribute_qualifier(type, index), array_type, ";");

	is_using_builtin_array = false;
	return result;
}